

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTDMT_CCtxParam_setMTCtxParameter
                 (ZSTD_CCtx_params *params,ZSTDMT_parameter parameter,int value)

{
  uint uVar1;
  size_t sVar2;
  
  if (parameter == ZSTDMT_p_rsyncable) {
    uVar1 = 0;
    if (0 < value) {
      uVar1 = value;
    }
    sVar2 = 9;
    if ((int)uVar1 < 9) {
      sVar2 = (size_t)uVar1;
    }
    if ((uint)value < 10) {
      sVar2 = (size_t)(uint)value;
    }
    params->rsyncable = (int)sVar2;
  }
  else {
    if (parameter == ZSTDMT_p_overlapLog) {
      uVar1 = 0;
      if (0 < value) {
        uVar1 = value;
      }
      sVar2 = 9;
      if ((int)uVar1 < 9) {
        sVar2 = (size_t)uVar1;
      }
      if ((uint)value < 10) {
        sVar2 = (size_t)(uint)value;
      }
      params->overlapLog = (int)sVar2;
      return sVar2;
    }
    sVar2 = 0xffffffffffffffd8;
    if (parameter == ZSTDMT_p_jobSize) {
      uVar1 = 0x100000;
      if (0x100000 < value) {
        uVar1 = value;
      }
      sVar2 = (size_t)uVar1;
      if (0x3fffffff < (int)uVar1) {
        sVar2 = 0x40000000;
      }
      if (value == 0) {
        sVar2 = 0;
      }
      params->jobSize = sVar2;
      return sVar2;
    }
  }
  return sVar2;
}

Assistant:

size_t
ZSTDMT_CCtxParam_setMTCtxParameter(ZSTD_CCtx_params* params,
                                   ZSTDMT_parameter parameter,
                                   int value)
{
    DEBUGLOG(4, "ZSTDMT_CCtxParam_setMTCtxParameter");
    switch(parameter)
    {
    case ZSTDMT_p_jobSize :
        DEBUGLOG(4, "ZSTDMT_CCtxParam_setMTCtxParameter : set jobSize to %i", value);
        return ZSTD_CCtxParams_setParameter(params, ZSTD_c_jobSize, value);
    case ZSTDMT_p_overlapLog :
        DEBUGLOG(4, "ZSTDMT_p_overlapLog : %i", value);
        return ZSTD_CCtxParams_setParameter(params, ZSTD_c_overlapLog, value);
    case ZSTDMT_p_rsyncable :
        DEBUGLOG(4, "ZSTD_p_rsyncable : %i", value);
        return ZSTD_CCtxParams_setParameter(params, ZSTD_c_rsyncable, value);
    default :
        return ERROR(parameter_unsupported);
    }
}